

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void pushpop_inuse_regs(dill_stream c,int pop,virtual_insn *ip)

{
  undefined4 in_ESI;
  long *in_RDI;
  int i;
  int local_1c;
  
  for (local_1c = 0; local_1c < *(int *)(in_RDI[1] + 0x1a0); local_1c = local_1c + 1) {
    if (*(char *)(*(long *)(in_RDI[1] + 0x1b0) + (long)local_1c * 0x14 + 1) != '\0') {
      (**(code **)(*in_RDI + 0x178))
                (in_RDI,in_ESI,(int)*(char *)(*(long *)(in_RDI[1] + 0x1b0) + (long)local_1c * 0x14),
                 *(undefined4 *)(*(long *)(in_RDI[1] + 0x1b0) + (long)local_1c * 0x14 + 4));
    }
  }
  return;
}

Assistant:

static void
pushpop_inuse_regs(dill_stream c, int pop, virtual_insn* ip)
{
    int i = 0;
    /* no actual reg assigns, so only the params are in use */
    for (i = 0; i < c->p->c_param_count; i++) {
        if (c->p->c_param_args[i].is_register) {
            c->j->save_restore(c, pop, c->p->c_param_args[i].type,
                               c->p->c_param_args[i].in_reg);
        }
    }
}